

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sha512_256.c
# Opt level: O1

CURLcode Curl_sha512_256_init(void *context)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  CURLcode CVar2;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  *(EVP_MD_CTX **)context = ctx;
  if (ctx == (EVP_MD_CTX *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    type = (EVP_MD *)EVP_sha512_256();
    CVar2 = CURLE_OK;
    iVar1 = EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
    if (iVar1 == 0) {
      EVP_MD_CTX_free(*context);
      CVar2 = CURLE_FAILED_INIT;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode
Curl_sha512_256_init(void *context)
{
  Curl_sha512_256_ctx *const ctx = (Curl_sha512_256_ctx *)context;

  *ctx = EVP_MD_CTX_create();
  if(!*ctx)
    return CURLE_OUT_OF_MEMORY;

  if(EVP_DigestInit_ex(*ctx, EVP_sha512_256(), NULL)) {
    /* Check whether the header and this file use the same numbers */
    DEBUGASSERT(EVP_MD_CTX_size(*ctx) == CURL_SHA512_256_DIGEST_SIZE);
    /* Check whether the block size is correct */
    DEBUGASSERT(EVP_MD_CTX_block_size(*ctx) == CURL_SHA512_256_BLOCK_SIZE);

    return CURLE_OK; /* Success */
  }

  /* Cleanup */
  EVP_MD_CTX_destroy(*ctx);
  return CURLE_FAILED_INIT;
}